

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O3

void duckdb::LeastGreatestFunction<short,duckdb::LessThan,duckdb::StandardLeastGreatest<false>>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  short sVar1;
  pointer pVVar2;
  pointer pVVar3;
  data_ptr_t pdVar4;
  unsigned_long *puVar5;
  idx_t iVar6;
  sel_t *psVar7;
  reference pvVar8;
  VectorType vector_type_p;
  idx_t iVar9;
  idx_t iVar10;
  size_type sVar11;
  UnifiedVectorFormat vdata;
  bool result_has_value [2048];
  UnifiedVectorFormat local_880;
  bool local_838 [2056];
  
  pVVar2 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar3 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)pVVar3 - (long)pVVar2 == 0x68) {
    pvVar8 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
    Vector::Reference(result,pvVar8);
    return;
  }
  if (pVVar3 == pVVar2) {
    switchD_00569a20::default(local_838,0,0x800);
    vector_type_p = CONSTANT_VECTOR;
  }
  else {
    vector_type_p = CONSTANT_VECTOR;
    sVar11 = 0;
    do {
      pvVar8 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar11);
      if (pvVar8->vector_type != CONSTANT_VECTOR) {
        vector_type_p = FLAT_VECTOR;
      }
      sVar11 = sVar11 + 1;
      pVVar2 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_start;
      pVVar3 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (sVar11 < (ulong)(((long)pVVar3 - (long)pVVar2 >> 3) * 0x4ec4ec4ec4ec4ec5));
    pdVar4 = result->data;
    switchD_00569a20::default(local_838,0,0x800);
    if (pVVar3 != pVVar2) {
      sVar11 = 0;
      do {
        pvVar8 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar11);
        if (pvVar8->vector_type == CONSTANT_VECTOR) {
          pvVar8 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar11);
          puVar5 = (pvVar8->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) goto LAB_00f8c435;
        }
        else {
LAB_00f8c435:
          UnifiedVectorFormat::UnifiedVectorFormat(&local_880);
          pvVar8 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar11);
          Vector::ToUnifiedFormat(pvVar8,args->count,&local_880);
          iVar6 = args->count;
          if (local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (iVar6 != 0) {
              psVar7 = (local_880.sel)->sel_vector;
              iVar9 = 0;
              do {
                iVar10 = iVar9;
                if (psVar7 != (sel_t *)0x0) {
                  iVar10 = (idx_t)psVar7[iVar9];
                }
                sVar1 = *(short *)(local_880.data + iVar10 * 2);
                if ((local_838[iVar9] != true) || (sVar1 < *(short *)(pdVar4 + iVar9 * 2))) {
                  local_838[iVar9] = true;
                  *(short *)(pdVar4 + iVar9 * 2) = sVar1;
                }
                iVar9 = iVar9 + 1;
              } while (iVar6 != iVar9);
            }
          }
          else if (iVar6 != 0) {
            psVar7 = (local_880.sel)->sel_vector;
            iVar9 = 0;
            do {
              iVar10 = iVar9;
              if (psVar7 != (sel_t *)0x0) {
                iVar10 = (idx_t)psVar7[iVar9];
              }
              if (((local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [iVar10 >> 6] >> (iVar10 & 0x3f) & 1) != 0) &&
                 ((sVar1 = *(short *)(local_880.data + iVar10 * 2), local_838[iVar9] != true ||
                  (sVar1 < *(short *)(pdVar4 + iVar9 * 2))))) {
                local_838[iVar9] = true;
                *(short *)(pdVar4 + iVar9 * 2) = sVar1;
              }
              iVar9 = iVar9 + 1;
            } while (iVar6 != iVar9);
          }
          if (local_880.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_880.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_880.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        sVar11 = sVar11 + 1;
      } while (sVar11 < (ulong)(((long)(args->data).
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(args->data).
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3) *
                               0x4ec4ec4ec4ec4ec5));
    }
  }
  StandardLeastGreatest<false>::FinalizeResult(args->count,local_838,result,state);
  Vector::SetVectorType(result,vector_type_p);
  return;
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}